

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode
JsDiagSetBreakOnException
          (JsRuntimeHandle runtimeHandle,JsDiagBreakOnExceptionAttributes exceptionAttributes)

{
  bool bVar1;
  JsrtDebugManager *this;
  JsErrorCode JVar2;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    this = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
    JVar2 = JsErrorDiagNotInDebugMode;
    if (this != (JsrtDebugManager *)0x0) {
      bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this);
      if (bVar1) {
        JVar2 = JsNoError;
        JsrtDebugManager::SetBreakOnException(this,exceptionAttributes);
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar2;
}

Assistant:

CHAKRA_API JsDiagSetBreakOnException(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsDiagBreakOnExceptionAttributes exceptionAttributes)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        jsrtDebugManager->SetBreakOnException(exceptionAttributes);

        return JsNoError;
    });
#endif
}